

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O3

void do_cmd_choose_map(command *cmd)

{
  uint in_EAX;
  int iVar1;
  int *inc;
  long lVar2;
  int *spent;
  player *st;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  world = maps;
  cmd_get_arg_choice((command_conflict *)cmd,"choice",(int *)((long)&uStack_18 + 4));
  iVar1 = uStack_18._4_4_;
  if (uStack_18._4_4_ != 0) {
    do {
      world = world->next;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    uStack_18 = uStack_18 & 0xffffffff;
  }
  lVar2 = 0;
  spent = (int *)0x0;
  st = player;
  player_generate(player,(player_race *)0x0,(player_class *)0x0,false);
  points_left = L'\x14';
  points_spent[0] = 0;
  points_spent[1] = 0;
  points_spent[2] = 0;
  points_spent[3] = 0;
  points_spent[4] = 0;
  do {
    *(undefined4 *)((long)stats + lVar2) = 10;
    *(undefined4 *)((long)points_inc + lVar2) = 1;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x14);
  generate_stats((int *)st,spent,inc,points_inc);
  rolled_stats = 0;
  return;
}

Assistant:

void do_cmd_choose_map(struct command *cmd)
{
	int choice = 0;
	world = maps;
	cmd_get_arg_choice(cmd, "choice", &choice);
	while (choice) {
		world = world->next;
		choice--;
	}
	player_generate(player, NULL, NULL, false);

	reset_stats(stats, points_spent, points_inc, &points_left, false);
	generate_stats(stats, points_spent, points_inc, &points_left);
	rolled_stats = false;
}